

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,string *make,
          string *makeArgs,string *path,string *homeOutputDir)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined1 uVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t",3);
  uVar2 = 0x20;
  if (AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::JsonSep != '\0') {
    uVar2 = 0x2c;
  }
  uStack_38 = CONCAT17(uVar2,(undefined7)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)((long)&uStack_38 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\"name\":\"",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(target->_M_dataplus)._M_p,target->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"build_cmd\":\"",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -C \\\"",6);
  if (this->UseNinja != false) {
    path = homeOutputDir;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\\\" ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(target->_M_dataplus)._M_p,target->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"}\n",3);
  AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::JsonSep = 1;
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                        const std::string& target,
                                        const std::string& make,
                                        const std::string& makeArgs,
                                        const std::string& path,
                                        const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  fout << "\t\t\t" << JsonSep << "{\"name\":\"" << target
       << "\", "
          "\"build_cmd\":\""
       << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
       << "\\\" " << makeArgs << " " << target << "\"}\n";

  JsonSep = ',';
}